

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

bool __thiscall GlobOptBlockData::IsLive(GlobOptBlockData *this,Sym *sym)

{
  BOOLEAN BVar1;
  StackSym *pSVar2;
  bool local_29;
  bool local_19;
  Sym *sym_local;
  GlobOptBlockData *this_local;
  
  pSVar2 = StackSym::GetVarEquivStackSym_NoCreate(sym);
  local_19 = false;
  if (pSVar2 != (StackSym *)0x0) {
    BVar1 = BVSparse<Memory::JitArenaAllocator>::Test(this->liveVarSyms,(pSVar2->super_Sym).m_id);
    local_29 = true;
    if (BVar1 == '\0') {
      BVar1 = BVSparse<Memory::JitArenaAllocator>::Test
                        (this->liveInt32Syms,(pSVar2->super_Sym).m_id);
      local_29 = true;
      if (BVar1 == '\0') {
        BVar1 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->liveFloat64Syms,(pSVar2->super_Sym).m_id);
        local_29 = BVar1 != '\0';
      }
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool
GlobOptBlockData::IsLive(Sym const * sym) const
{
    sym = StackSym::GetVarEquivStackSym_NoCreate(sym);
    return
        sym &&
        (
        this->liveVarSyms->Test(sym->m_id) ||
        this->liveInt32Syms->Test(sym->m_id) ||
        this->liveFloat64Syms->Test(sym->m_id)
        );
}